

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_catalog(void)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  FILE *pFVar28;
  long lVar29;
  xmlDocPtr pxVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  int n_value_1;
  undefined8 *puVar33;
  int n_value;
  uint uVar34;
  uint uVar35;
  undefined8 uVar36;
  int test_ret_8;
  ulong uVar37;
  int test_ret_4;
  int test_ret_3;
  int test_ret_14;
  uint uVar38;
  int test_ret_1;
  int test_ret;
  int test_ret_2;
  int test_ret_5;
  int local_4c;
  uint local_48;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing catalog : 27 of 36 functions ...");
  }
  iVar1 = 0;
  uVar38 = 0;
  do {
    uVar37 = 0;
    do {
      uVar34 = 0;
      puVar33 = &DAT_00162d68;
      do {
        iVar4 = xmlMemBlocks();
        if (uVar38 < 4) {
          uVar36 = (&DAT_00162d68)[uVar38];
        }
        else {
          uVar36 = 0;
        }
        if ((uint)uVar37 < 4) {
          uVar32 = (&DAT_00162d68)[uVar37];
        }
        else {
          uVar32 = 0;
        }
        if (uVar34 < 4) {
          uVar31 = *puVar33;
        }
        else {
          uVar31 = 0;
        }
        xmlACatalogAdd(0,uVar36,uVar32,uVar31);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlACatalogAdd",(ulong)(uint)(iVar5 - iVar4));
          iVar1 = iVar1 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar38);
          printf(" %d",uVar37);
          printf(" %d");
          putchar(10);
        }
        uVar34 = uVar34 + 1;
        puVar33 = puVar33 + 1;
      } while (uVar34 != 5);
      uVar34 = (uint)uVar37 + 1;
      uVar37 = (ulong)uVar34;
    } while (uVar34 != 5);
    uVar38 = uVar38 + 1;
  } while (uVar38 != 5);
  function_tests = function_tests + 1;
  uVar38 = 0;
  local_4c = 0;
  bVar3 = true;
  do {
    bVar2 = bVar3;
    iVar4 = xmlMemBlocks();
    if (bVar2) {
      pFVar28 = fopen64("test.out","a+");
    }
    else {
      pFVar28 = (FILE *)0x0;
    }
    xmlACatalogDump(0,pFVar28);
    call_tests = call_tests + 1;
    if (pFVar28 != (FILE *)0x0) {
      fclose(pFVar28);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlACatalogDump",(ulong)(uint)(iVar5 - iVar4));
      local_4c = local_4c + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar38);
      putchar(10);
    }
    uVar38 = 1;
    bVar3 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  puVar33 = &DAT_00162d68;
  uVar38 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar38 < 4) {
      uVar36 = *puVar33;
    }
    else {
      uVar36 = 0;
    }
    xmlACatalogRemove(0,uVar36);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlACatalogRemove",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar38 = uVar38 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar38 != 5);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar38 = 0;
  do {
    puVar33 = &DAT_00162d68;
    uVar34 = 0;
    do {
      iVar6 = xmlMemBlocks();
      if (uVar38 < 4) {
        uVar36 = (&DAT_00162d68)[uVar38];
      }
      else {
        uVar36 = 0;
      }
      if (uVar34 < 4) {
        uVar32 = *puVar33;
      }
      else {
        uVar32 = 0;
      }
      lVar29 = xmlACatalogResolve(0,uVar36,uVar32);
      if (lVar29 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlACatalogResolve",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar38);
        printf(" %d");
        putchar(10);
      }
      uVar34 = uVar34 + 1;
      puVar33 = puVar33 + 1;
    } while (uVar34 != 5);
    uVar38 = uVar38 + 1;
  } while (uVar38 != 5);
  function_tests = function_tests + 1;
  puVar33 = &DAT_00162d68;
  uVar38 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar38 < 4) {
      uVar36 = *puVar33;
    }
    else {
      uVar36 = 0;
    }
    lVar29 = xmlACatalogResolvePublic(0,uVar36);
    if (lVar29 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlACatalogResolvePublic",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar38 = uVar38 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar38 != 5);
  function_tests = function_tests + 1;
  puVar33 = &DAT_00162d68;
  uVar38 = 0;
  local_34 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar38 < 4) {
      uVar36 = *puVar33;
    }
    else {
      uVar36 = 0;
    }
    lVar29 = xmlACatalogResolveSystem(0,uVar36);
    if (lVar29 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlACatalogResolveSystem",(ulong)(uint)(iVar8 - iVar7));
      local_34 = local_34 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar38 = uVar38 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar38 != 5);
  function_tests = function_tests + 1;
  puVar33 = &DAT_00162d68;
  uVar38 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar38 < 4) {
      uVar36 = *puVar33;
    }
    else {
      uVar36 = 0;
    }
    lVar29 = xmlACatalogResolveURI(0,uVar36);
    if (lVar29 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlACatalogResolveURI",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar38 = uVar38 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar38 != 5);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar38 = 0;
  do {
    uVar34 = 0;
    do {
      uVar35 = 0;
      puVar33 = &DAT_00162d68;
      do {
        iVar9 = xmlMemBlocks();
        if (uVar38 < 4) {
          uVar36 = (&DAT_00162d68)[uVar38];
        }
        else {
          uVar36 = 0;
        }
        if (uVar34 < 4) {
          uVar32 = (&DAT_00162d68)[uVar34];
        }
        else {
          uVar32 = 0;
        }
        if (uVar35 < 4) {
          uVar31 = *puVar33;
        }
        else {
          uVar31 = 0;
        }
        xmlCatalogAdd(uVar36,uVar32,uVar31);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCatalogAdd",(ulong)(uint)(iVar10 - iVar9));
          iVar8 = iVar8 + 1;
          printf(" %d",(ulong)uVar38);
          printf(" %d",(ulong)uVar34);
          printf(" %d");
          putchar(10);
        }
        uVar35 = uVar35 + 1;
        puVar33 = puVar33 + 1;
      } while (uVar35 != 5);
      uVar34 = uVar34 + 1;
    } while (uVar34 != 5);
    uVar38 = uVar38 + 1;
  } while (uVar38 != 5);
  function_tests = function_tests + 1;
  xmlCatalogCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  xmlCatalogConvert();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  uVar38 = 0;
  iVar9 = 0;
  bVar3 = true;
  do {
    bVar2 = bVar3;
    iVar10 = xmlMemBlocks();
    if (bVar2) {
      pFVar28 = fopen64("test.out","a+");
    }
    else {
      pFVar28 = (FILE *)0x0;
    }
    xmlCatalogDump(pFVar28);
    call_tests = call_tests + 1;
    if (pFVar28 != (FILE *)0x0) {
      fclose(pFVar28);
    }
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogDump",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      printf(" %d",(ulong)uVar38);
      putchar(10);
    }
    uVar38 = 1;
    bVar3 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  xmlCatalogGetDefaults();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    iVar12 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCatalogGetDefaults",(ulong)(uint)(iVar12 - iVar10));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar12 = xmlMemBlocks();
  xmlCatalogIsEmpty(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar12 != iVar13) {
    iVar14 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCatalogIsEmpty",(ulong)(uint)(iVar14 - iVar12));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar14 = 0;
  uVar38 = 0;
  bVar3 = true;
  do {
    bVar2 = bVar3;
    uVar34 = 0;
    do {
      puVar33 = &DAT_00162d68;
      uVar35 = 0;
      do {
        iVar15 = xmlMemBlocks();
        if (uVar34 < 4) {
          uVar36 = (&DAT_00162d68)[uVar34];
        }
        else {
          uVar36 = 0;
        }
        if (uVar35 < 4) {
          uVar32 = *puVar33;
        }
        else {
          uVar32 = 0;
        }
        lVar29 = xmlCatalogLocalResolve(0,uVar36,uVar32);
        if (lVar29 != 0) {
          (*_xmlFree)();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar16 = xmlMemBlocks();
        if (iVar15 != iVar16) {
          iVar16 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCatalogLocalResolve",(ulong)(uint)(iVar16 - iVar15))
          ;
          iVar14 = iVar14 + 1;
          printf(" %d",(ulong)uVar38);
          printf(" %d",(ulong)uVar34);
          printf(" %d");
          putchar(10);
        }
        uVar35 = uVar35 + 1;
        puVar33 = puVar33 + 1;
      } while (uVar35 != 5);
      uVar34 = uVar34 + 1;
    } while (uVar34 != 5);
    uVar38 = 1;
    bVar3 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar15 = 0;
  uVar38 = 0;
  bVar3 = true;
  do {
    bVar2 = bVar3;
    uVar34 = 0;
    puVar33 = &DAT_00162d68;
    do {
      iVar16 = xmlMemBlocks();
      if (uVar34 < 4) {
        uVar36 = *puVar33;
      }
      else {
        uVar36 = 0;
      }
      lVar29 = xmlCatalogLocalResolveURI(0,uVar36);
      if (lVar29 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar16 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCatalogLocalResolveURI",(ulong)(uint)(iVar17 - iVar16)
              );
        iVar15 = iVar15 + 1;
        printf(" %d",(ulong)uVar38);
        printf(" %d");
        putchar(10);
      }
      uVar34 = uVar34 + 1;
      puVar33 = puVar33 + 1;
    } while (uVar34 != 5);
    uVar38 = 1;
    uVar34 = 0;
    bVar3 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  puVar33 = &DAT_00162d68;
  do {
    if (uVar34 < 4) {
      uVar36 = *puVar33;
    }
    else {
      uVar36 = 0;
    }
    xmlCatalogRemove(uVar36);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar34 = uVar34 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  uVar38 = 0;
  do {
    puVar33 = &DAT_00162d68;
    uVar34 = 0;
    do {
      if (uVar38 < 4) {
        uVar36 = (&DAT_00162d68)[uVar38];
      }
      else {
        uVar36 = 0;
      }
      if (uVar34 < 4) {
        uVar32 = *puVar33;
      }
      else {
        uVar32 = 0;
      }
      lVar29 = xmlCatalogResolve(uVar36,uVar32);
      if (lVar29 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      uVar34 = uVar34 + 1;
      puVar33 = puVar33 + 1;
    } while (uVar34 != 5);
    uVar38 = uVar38 + 1;
  } while (uVar38 != 5);
  function_tests = function_tests + 1;
  puVar33 = &DAT_00162d68;
  uVar38 = 0;
  iVar16 = 0;
  do {
    iVar17 = xmlMemBlocks();
    if (uVar38 < 4) {
      uVar36 = *puVar33;
    }
    else {
      uVar36 = 0;
    }
    lVar29 = xmlCatalogResolvePublic(uVar36);
    if (lVar29 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogResolvePublic",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      printf(" %d",(ulong)uVar38);
      putchar(10);
    }
    uVar38 = uVar38 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar38 != 5);
  function_tests = function_tests + 1;
  puVar33 = &DAT_00162d68;
  uVar38 = 0;
  iVar17 = 0;
  do {
    iVar18 = xmlMemBlocks();
    if (uVar38 < 4) {
      uVar36 = *puVar33;
    }
    else {
      uVar36 = 0;
    }
    lVar29 = xmlCatalogResolveSystem(uVar36);
    if (lVar29 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogResolveSystem",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      printf(" %d",(ulong)uVar38);
      putchar(10);
    }
    uVar38 = uVar38 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar38 != 5);
  function_tests = function_tests + 1;
  puVar33 = &DAT_00162d68;
  uVar38 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    if (uVar38 < 4) {
      uVar36 = *puVar33;
    }
    else {
      uVar36 = 0;
    }
    lVar29 = xmlCatalogResolveURI(uVar36);
    if (lVar29 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogResolveURI",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      printf(" %d",(ulong)uVar38);
      putchar(10);
    }
    uVar38 = uVar38 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar38 != 5);
  function_tests = function_tests + 1;
  uVar38 = 0;
  iVar19 = 0;
  do {
    iVar20 = xmlMemBlocks();
    xmlCatalogSetDefaultPrefer(uVar38 == 2);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogSetDefaultPrefer",(ulong)(uint)(iVar21 - iVar20))
      ;
      iVar19 = iVar19 + 1;
      printf(" %d",(ulong)uVar38);
      putchar(10);
    }
    uVar38 = uVar38 + 1;
  } while (uVar38 != 3);
  function_tests = function_tests + 1;
  uVar38 = 0xffffffff;
  iVar21 = 1;
  iVar20 = 0;
  do {
    uVar34 = 3;
    if (3 < uVar38) {
      uVar34 = uVar38;
    }
    uVar38 = uVar38 + 1;
    iVar22 = xmlMemBlocks();
    xmlCatalogSetDefaults(uVar34 + iVar21);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar23 = xmlMemBlocks();
    if (iVar22 != iVar23) {
      iVar23 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogSetDefaults",(ulong)(uint)(iVar23 - iVar22));
      iVar20 = iVar20 + 1;
      printf(" %d",(ulong)uVar38);
      putchar(10);
    }
    iVar21 = iVar21 + -1;
  } while (uVar38 != 3);
  function_tests = function_tests + 1;
  iVar21 = xmlMemBlocks();
  xmlConvertSGMLCatalog(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar22 = xmlMemBlocks();
  if (iVar21 != iVar22) {
    iVar23 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlConvertSGMLCatalog",(ulong)(uint)(iVar23 - iVar21));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar23 = xmlMemBlocks();
  xmlInitializeCatalog();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar24 = xmlMemBlocks();
  if (iVar23 != iVar24) {
    iVar25 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlInitializeCatalog",(ulong)(uint)(iVar25 - iVar23));
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar38 = 0;
  puVar33 = &DAT_00162d88;
  do {
    if (uVar38 < 7) {
      uVar36 = *puVar33;
    }
    else {
      uVar36 = 0;
    }
    xmlLoadCatalog(uVar36);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar38 = uVar38 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar38 != 8);
  function_tests = function_tests + 1;
  uVar38 = 0;
  puVar33 = &DAT_00162d50;
  do {
    if (uVar38 < 3) {
      uVar36 = *puVar33;
    }
    else {
      uVar36 = 0;
    }
    xmlLoadCatalogs(uVar36);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar38 = uVar38 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar38 != 4);
  function_tests = function_tests + 1;
  puVar33 = &DAT_00162d88;
  uVar38 = 0;
  iVar25 = 0;
  do {
    iVar26 = xmlMemBlocks();
    if (uVar38 < 7) {
      uVar36 = *puVar33;
    }
    else {
      uVar36 = 0;
    }
    pxVar30 = (xmlDocPtr)xmlParseCatalogFile(uVar36);
    if (api_doc != pxVar30) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar27 = xmlMemBlocks();
    if (iVar26 != iVar27) {
      iVar27 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseCatalogFile",(ulong)(uint)(iVar27 - iVar26));
      iVar25 = iVar25 + 1;
      printf(" %d",(ulong)uVar38);
      putchar(10);
    }
    uVar38 = uVar38 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar38 != 8);
  local_48 = (uint)(iVar23 != iVar24);
  function_tests = function_tests + 1;
  uVar38 = local_4c + iVar1 + iVar4 + iVar5 + iVar6 + local_34 + iVar7 + iVar8 + iVar9 +
           (uint)(iVar10 != iVar11) + (uint)(iVar12 != iVar13) + iVar14 + iVar15 + iVar16 + iVar17 +
           iVar18 + iVar19 + iVar20 + (uint)(iVar21 != iVar22) + local_48 + iVar25;
  if (uVar38 != 0) {
    printf("Module catalog: %d errors\n",(ulong)uVar38);
  }
  return uVar38;
}

Assistant:

static int
test_catalog(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing catalog : 27 of 36 functions ...\n");
    test_ret += test_xmlACatalogAdd();
    test_ret += test_xmlACatalogDump();
    test_ret += test_xmlACatalogRemove();
    test_ret += test_xmlACatalogResolve();
    test_ret += test_xmlACatalogResolvePublic();
    test_ret += test_xmlACatalogResolveSystem();
    test_ret += test_xmlACatalogResolveURI();
    test_ret += test_xmlCatalogAdd();
    test_ret += test_xmlCatalogCleanup();
    test_ret += test_xmlCatalogConvert();
    test_ret += test_xmlCatalogDump();
    test_ret += test_xmlCatalogGetDefaults();
    test_ret += test_xmlCatalogIsEmpty();
    test_ret += test_xmlCatalogLocalResolve();
    test_ret += test_xmlCatalogLocalResolveURI();
    test_ret += test_xmlCatalogRemove();
    test_ret += test_xmlCatalogResolve();
    test_ret += test_xmlCatalogResolvePublic();
    test_ret += test_xmlCatalogResolveSystem();
    test_ret += test_xmlCatalogResolveURI();
    test_ret += test_xmlCatalogSetDefaultPrefer();
    test_ret += test_xmlCatalogSetDefaults();
    test_ret += test_xmlConvertSGMLCatalog();
    test_ret += test_xmlInitializeCatalog();
    test_ret += test_xmlLoadACatalog();
    test_ret += test_xmlLoadCatalog();
    test_ret += test_xmlLoadCatalogs();
    test_ret += test_xmlLoadSGMLSuperCatalog();
    test_ret += test_xmlNewCatalog();
    test_ret += test_xmlParseCatalogFile();

    if (test_ret != 0)
	printf("Module catalog: %d errors\n", test_ret);
    return(test_ret);
}